

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::convolveTransitionMatrices
          (BeagleCPUImpl<float,_1,_0> *this,int *firstIndices,int *secondIndices,int *resultIndices,
          int matrixCount)

{
  uint uVar1;
  uint uVar2;
  float **ppfVar3;
  float *pfVar4;
  long lVar5;
  int i;
  int iVar6;
  uint uVar7;
  float *pfVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  undefined1 auVar18 [16];
  
  ppfVar3 = this->gTransitionMatrices;
  uVar13 = 0;
  uVar1 = this->kCategoryCount;
  while( true ) {
    if (uVar13 == (uint)(~(matrixCount >> 0x1f) & matrixCount)) {
      return 0;
    }
    iVar6 = resultIndices[uVar13];
    if ((firstIndices[uVar13] == iVar6) || (secondIndices[uVar13] == iVar6)) break;
    uVar2 = this->kStateCount;
    pfVar17 = ppfVar3[firstIndices[uVar13]];
    pfVar15 = ppfVar3[secondIndices[uVar13]];
    pfVar4 = ppfVar3[iVar6];
    iVar9 = 0;
    iVar6 = this->kTransPaddedStateCount * uVar2;
    for (uVar14 = 0; uVar14 != (~((int)uVar1 >> 0x1f) & uVar1); uVar14 = uVar14 + 1) {
      for (uVar7 = 0; uVar7 != (~((int)uVar2 >> 0x1f) & uVar2); uVar7 = uVar7 + 1) {
        lVar10 = (long)iVar9;
        pfVar8 = pfVar15;
        for (uVar12 = 0; uVar12 != uVar2; uVar12 = uVar12 + 1) {
          auVar18 = ZEXT816(0) << 0x40;
          uVar11 = 0;
          pfVar16 = pfVar8;
          while (uVar2 != uVar11) {
            lVar5 = (long)(int)(uVar7 * this->kTransPaddedStateCount) + uVar11;
            uVar11 = uVar11 + 1;
            auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)pfVar17[lVar5]),ZEXT416((uint)*pfVar16))
            ;
            pfVar16 = pfVar16 + this->kTransPaddedStateCount;
          }
          pfVar4[lVar10] = auVar18._0_4_;
          lVar10 = lVar10 + 1;
          pfVar8 = pfVar8 + 1;
        }
        pfVar4[(int)lVar10] = 1.0;
        iVar9 = (int)lVar10 + 1;
      }
      pfVar17 = pfVar17 + iVar6;
      pfVar15 = pfVar15 + iVar6;
    }
    uVar13 = uVar13 + 1;
  }
  return -5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::convolveTransitionMatrices(const int* firstIndices,
        const int* secondIndices,
        const int* resultIndices,
        int matrixCount) {

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Entering BeagleCPUImpl::convolveTransitionMatrices \n");
#endif

    int returnCode = BEAGLE_SUCCESS;

    for (int u = 0; u < matrixCount; u++) {

        if(firstIndices[u] == resultIndices[u] || secondIndices[u] == resultIndices[u]) {

#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr, "In-place convolution is not allowed \n");
#endif

            returnCode = BEAGLE_ERROR_OUT_OF_RANGE;
            break;

        }//END: overwrite check

        REALTYPE* C = gTransitionMatrices[resultIndices[u]];
        REALTYPE* A = gTransitionMatrices[firstIndices[u]];
        REALTYPE* B = gTransitionMatrices[secondIndices[u]];

        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {

            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {

                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++) {
                        sum += A[k + kTransPaddedStateCount * i] * B[j + kTransPaddedStateCount * k];
                    }
//                  printf("%.30f %.30f %d: \n", C[n], sum, l);
                    C[n] = sum;
                    n++;

                }//END: j loop

                if (T_PAD != 0) {

                    //                      A[n] = 1.0;
                    //                      B[n] = 1.0;
                    C[n] = 1.0;

                    n += T_PAD;

                }//END: padding check

            }//END: i loop

            A += kStateCount * kTransPaddedStateCount;
            B += kStateCount * kTransPaddedStateCount;

        }//END: rates loop

    }//END: u loop

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Leaving BeagleCPUImpl::convolveTransitionMatrices \n");
#endif

    return returnCode;
}